

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O1

ALLEGRO_PATH * al_create_path(char *str)

{
  _Bool _Var1;
  int end_pos;
  ALLEGRO_PATH *pAVar2;
  ALLEGRO_USTR *pAVar3;
  ALLEGRO_USTR *us2;
  ALLEGRO_USTR *us2_00;
  ALLEGRO_USTR *us1;
  char *pcVar4;
  undefined8 *puVar5;
  ALLEGRO_USTR *pAVar6;
  size_t sVar7;
  int start_pos;
  _AL_VECTOR *vec;
  ALLEGRO_USTR_INFO dotdot_info;
  ALLEGRO_USTR_INFO dot_info;
  ALLEGRO_USTR_INFO local_50;
  ALLEGRO_USTR_INFO local_40;
  
  pAVar2 = (ALLEGRO_PATH *)
           al_malloc_with_context
                     (0x40,0xa0,
                      "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/path.c"
                      ,"al_create_path");
  if (pAVar2 == (ALLEGRO_PATH *)0x0) {
    pAVar2 = (ALLEGRO_PATH *)0x0;
  }
  else {
    pAVar3 = al_ustr_new("");
    pAVar2->drive = pAVar3;
    pAVar3 = al_ustr_new("");
    pAVar2->filename = pAVar3;
    vec = &pAVar2->segments;
    _al_vector_init(vec,8);
    pAVar3 = al_ustr_new("");
    pAVar2->basename = pAVar3;
    pAVar3 = al_ustr_new("");
    pAVar2->full_string = pAVar3;
    if (str != (char *)0x0) {
      pAVar3 = al_ustr_new(str);
      start_pos = 0;
      al_ustr_find_replace_cstr(pAVar3,0,"\\","/");
      us2 = al_ref_cstr(&local_40,".");
      us2_00 = al_ref_cstr(&local_50,"..");
      us1 = al_ustr_new("");
      do {
        end_pos = al_ustr_find_chr(pAVar3,start_pos,0x2f);
        if (end_pos == -1) {
          sVar7 = al_ustr_size(pAVar3);
          al_ustr_assign_substr(us1,pAVar3,start_pos,(int)sVar7);
          _Var1 = al_ustr_equal(us1,us2);
          if (!_Var1) {
            _Var1 = al_ustr_equal(us1,us2_00);
            if (!_Var1) {
              al_ustr_assign(pAVar2->filename,us1);
              goto LAB_0015d4e5;
            }
          }
          pcVar4 = al_cstr(us1);
          puVar5 = (undefined8 *)_al_vector_alloc_back(vec);
          pAVar6 = al_ustr_new(pcVar4);
          *puVar5 = pAVar6;
        }
        else {
          al_ustr_assign_substr(us1,pAVar3,start_pos,end_pos);
          pcVar4 = al_cstr(us1);
          puVar5 = (undefined8 *)_al_vector_alloc_back(vec);
          pAVar6 = al_ustr_new(pcVar4);
          *puVar5 = pAVar6;
          start_pos = end_pos + 1;
        }
LAB_0015d4e5:
      } while (end_pos != -1);
      al_ustr_free(us1);
      al_ustr_free(pAVar3);
    }
  }
  return pAVar2;
}

Assistant:

ALLEGRO_PATH *al_create_path(const char *str)
{
   ALLEGRO_PATH *path;

   path = al_malloc(sizeof(ALLEGRO_PATH));
   if (!path)
      return NULL;

   path->drive = al_ustr_new("");
   path->filename = al_ustr_new("");
   _al_vector_init(&path->segments, sizeof(ALLEGRO_USTR *));
   path->basename = al_ustr_new("");
   path->full_string = al_ustr_new("");

   if (str != NULL) {
      ALLEGRO_USTR *copy = al_ustr_new(str);
      replace_backslashes(copy);

      if (!parse_path_string(copy, path)) {
         al_destroy_path(path);
         path = NULL;
      }

      al_ustr_free(copy);
   }

   return path;
}